

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBook.c
# Opt level: O2

uint Io_NtkWriteIntNode(FILE *pFile,Abc_Obj_t *pNode,int NodesOrPl)

{
  uint uVar1;
  Mio_Gate_t *pGate;
  ulong uVar2;
  int iVar3;
  Mio_Pin_t *pPin;
  char *pcVar4;
  char *pcVar5;
  Abc_Ntk_t *pAVar6;
  long lVar7;
  double dVar8;
  ulong uStack_40;
  
  if (pNode->pNtk->ntkFunc == ABC_FUNC_MAP) {
    pGate = (Mio_Gate_t *)(pNode->field_5).pData;
    pPin = Mio_GateReadPins(pGate);
    lVar7 = 0;
    while (pPin != (Mio_Pin_t *)0x0) {
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]]);
      fprintf((FILE *)pFile,"%s_",pcVar4);
      pPin = Mio_PinReadNext(pPin);
      lVar7 = lVar7 + 1;
    }
    if ((pNode->vFanins).nSize != (int)lVar7) {
      __assert_fail("i == Abc_ObjFaninNum(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x183,"unsigned int Io_NtkWriteNodeGate(FILE *, Abc_Obj_t *)");
    }
    pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    pcVar5 = Mio_GateReadName(pGate);
    fprintf((FILE *)pFile,"%s_%s\t",pcVar4,pcVar5);
    dVar8 = Mio_GateReadArea(pGate);
    uStack_40 = (ulong)dVar8;
    if (NodesOrPl != 0) {
      return (uint)uStack_40;
    }
    goto LAB_002eb53e;
  }
  for (lVar7 = 0; lVar7 < (pNode->vFanins).nSize; lVar7 = lVar7 + 1) {
    pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[lVar7]]);
    fprintf((FILE *)pFile,"%s_",pcVar4);
  }
  for (lVar7 = 0; lVar7 < (pNode->vFanouts).nSize; lVar7 = lVar7 + 1) {
    pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar7]]);
    fprintf((FILE *)pFile,"%s_",pcVar4);
  }
  fwrite("name\t",5,1,(FILE *)pFile);
  if (NodesOrPl != 0) {
    return 0;
  }
  uVar1 = (pNode->vFanins).nSize;
  iVar3 = Abc_NodeIsConst0(pNode);
  uStack_40 = 0;
  if ((iVar3 != 0) || (iVar3 = Abc_NodeIsConst1(pNode), iVar3 != 0)) goto LAB_002eb53e;
  iVar3 = Abc_NodeIsInv(pNode);
  if (iVar3 != 0) {
    uStack_40 = 1;
    goto LAB_002eb53e;
  }
  iVar3 = Abc_NodeIsBuf(pNode);
  uStack_40 = 2;
  if (iVar3 != 0) goto LAB_002eb53e;
  pAVar6 = pNode->pNtk;
  if (pAVar6->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x13e,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)");
  }
  if (pAVar6->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x354,"int Abc_NodeIsNand2(Abc_Obj_t *)");
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x355,"int Abc_NodeIsNand2(Abc_Obj_t *)");
  }
  if ((pNode->vFanins).nSize == 2) {
    pcVar4 = (char *)(pNode->field_5).pData;
    iVar3 = strcmp(pcVar4,"-0 1\n0- 1\n");
    if (((iVar3 == 0) || (iVar3 = strcmp(pcVar4,"0- 1\n-0 1\n"), iVar3 == 0)) ||
       (iVar3 = strcmp(pcVar4,"11 0\n"), iVar3 == 0)) goto LAB_002eb53e;
    pAVar6 = pNode->pNtk;
    if (pAVar6->ntkType != ABC_NTK_NETLIST) {
      __assert_fail("Abc_NtkIsNetlist(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x370,"int Abc_NodeIsNor2(Abc_Obj_t *)");
    }
  }
  if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                  ,0x371,"int Abc_NodeIsNor2(Abc_Obj_t *)");
  }
  if ((pNode->vFanins).nSize == 2) {
    if (pAVar6->ntkFunc != ABC_FUNC_SOP) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x376,"int Abc_NodeIsNor2(Abc_Obj_t *)");
    }
    pcVar4 = (char *)(pNode->field_5).pData;
    iVar3 = strcmp(pcVar4,"00 1\n");
    if (iVar3 == 0) goto LAB_002eb53e;
    iVar3 = Abc_SopIsAndType(pcVar4);
    if (iVar3 == 0) {
      pAVar6 = pNode->pNtk;
      if (pAVar6->ntkType != ABC_NTK_NETLIST) {
        __assert_fail("Abc_NtkIsNetlist(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x3a2,"int Abc_NodeIsOr2(Abc_Obj_t *)");
      }
      goto LAB_002eb639;
    }
  }
  else {
LAB_002eb639:
    if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x3a3,"int Abc_NodeIsOr2(Abc_Obj_t *)");
    }
    if ((pNode->vFanins).nSize != 2) {
LAB_002eb6bf:
      if ((*(uint *)&pNode->field_0x14 & 0xf) != 7) {
        __assert_fail("Abc_ObjIsNode(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x3bf,"int Abc_NodeIsXor2(Abc_Obj_t *)");
      }
      if ((pNode->vFanins).nSize == 2) {
        if (pAVar6->ntkFunc != ABC_FUNC_SOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                        ,0x3c4,"int Abc_NodeIsXor2(Abc_Obj_t *)");
        }
        pcVar4 = (char *)(pNode->field_5).pData;
        iVar3 = strcmp(pcVar4,"01 1\n10 1\n");
        uStack_40 = 5;
        uVar2 = 5;
        if (((iVar3 == 0) || (iVar3 = strcmp(pcVar4,"10 1\n01 1\n"), uStack_40 = uVar2, iVar3 == 0))
           || ((iVar3 = strcmp(pcVar4,"11 1\n00 1\n"), iVar3 == 0 ||
               (iVar3 = strcmp(pcVar4,"00 1\n11 1\n"), iVar3 == 0)))) goto LAB_002eb53e;
      }
      if (uVar1 < 3) {
        __assert_fail("isize > 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                      ,0x147,"unsigned int Io_NtkWriteIntNode(FILE *, Abc_Obj_t *, int)");
      }
      iVar3 = Abc_SopGetCubeNum((char *)(pNode->field_5).pData);
      uStack_40 = (ulong)(iVar3 + uVar1);
      goto LAB_002eb53e;
    }
    if (pAVar6->ntkFunc != ABC_FUNC_SOP) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                    ,0x3ac,"int Abc_NodeIsOr2(Abc_Obj_t *)");
    }
    iVar3 = Abc_SopIsOrType((char *)(pNode->field_5).pData);
    if (iVar3 == 0) {
      pcVar4 = (char *)(pNode->field_5).pData;
      iVar3 = strcmp(pcVar4,"01 0\n");
      if ((iVar3 != 0) && (iVar3 = strcmp(pcVar4,"10 0\n"), iVar3 != 0)) {
        iVar3 = strcmp(pcVar4,"00 0\n");
        uStack_40 = 3;
        if (iVar3 == 0) goto LAB_002eb53e;
        pAVar6 = pNode->pNtk;
        if (pAVar6->ntkType != ABC_NTK_NETLIST) {
          __assert_fail("Abc_NtkIsNetlist(pNtk)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWriteBook.c"
                        ,0x3be,"int Abc_NodeIsXor2(Abc_Obj_t *)");
        }
        goto LAB_002eb6bf;
      }
    }
  }
  uStack_40 = 3;
LAB_002eb53e:
  fprintf((FILE *)pFile," %d %d\n",uStack_40 & 0xffffffff,1);
  return (uint)uStack_40;
}

Assistant:

unsigned Io_NtkWriteIntNode( FILE * pFile, Abc_Obj_t * pNode, int NodesOrPl )
{
    unsigned sizex=0, sizey=coreHeight, isize=0;
    //double nx, ny, xstep, ystep;    
    Abc_Obj_t * pNeti, *pNeto;
    int i;
        
    // write the network after mapping 
    if ( Abc_NtkHasMapping(pNode->pNtk) )
        sizex=Io_NtkWriteNodeGate( pFile, pNode );
    else
    {
    Abc_ObjForEachFanin( pNode, pNeti, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeti) );
    Abc_ObjForEachFanout( pNode, pNeto, i )
        fprintf( pFile, "%s_", Abc_ObjName(pNeto) );    
    fprintf( pFile, "name\t" );
    
    if(NodesOrPl == NODES)
    {
        isize=Abc_ObjFaninNum(pNode);
        if ( Abc_NodeIsConst0(pNode) || Abc_NodeIsConst1(pNode) ) 
            sizex=0;
        else if ( Abc_NodeIsInv(pNode) )
            sizex=1;
        else if ( Abc_NodeIsBuf(pNode) )
            sizex=2;
        else
        {
            assert( Abc_NtkHasSop(pNode->pNtk) );
            if ( Abc_NodeIsNand2(pNode) || Abc_NodeIsNor2(pNode) )
            sizex=2;
        else if ( Abc_NodeIsAnd2(pNode) || Abc_NodeIsOr2(pNode) )
            sizex=3;
        else if ( Abc_NodeIsXor2(pNode) || Abc_NodeIsXnor2(pNode) )
            sizex=5;
        else
        {
            assert( isize > 2 );
            sizex=isize+Abc_SopGetCubeNum((char *)pNode->pData);
        }
        }
    }
    }
    if(NodesOrPl == NODES)
    {
    fprintf( pFile, " %d %d\n", sizex, sizey );

    // Equally place pins. Size pins needs /  isize+#output+1
    isize= isize + Abc_ObjFanoutNum(pNode) + 1;
    }
    return sizex*sizey;
    /*
    xstep = sizex / isize;
    ystep = sizey / isize;
    nx= -0.5 * sizex;
    ny= -0.5 * sizey;

    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    Abc_ObjForEachFanout( pNode, pFanout, i )
    {
            nx+= xstep;
            ny+= ystep;
            if (fabs(nx) < 0.001)
                    nx= 0;
            if (fabs(ny) < 0.001)
                    ny= 0;
    }
    */
}